

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O1

csp_iface_t * csp_iflist_iterate(csp_iface_t *ifc)

{
  csp_iface_s **ppcVar1;
  
  ppcVar1 = &interfaces;
  if (ifc != (csp_iface_t *)0x0) {
    ppcVar1 = &ifc->next;
  }
  return *ppcVar1;
}

Assistant:

csp_iface_t * csp_iflist_iterate(csp_iface_t * ifc) {

	/* Head of list */
	if (ifc == NULL) {
		ifc = interfaces;

	/* Otherwise, continue from user defined ifc */
	} else {
		ifc = ifc->next;
	}

	return ifc;

}